

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

bool __thiscall FIX::SocketAcceptor::onPoll(SocketAcceptor *this)

{
  bool bVar1;
  time_t tVar2;
  time_t local_28;
  time_t now;
  time_t start;
  SocketAcceptor *this_local;
  
  if (this->m_pServer == (SocketServer *)0x0) {
    return false;
  }
  now = 0;
  local_28 = 0;
  start = (time_t)this;
  bVar1 = Acceptor::isStopped(&this->super_Acceptor);
  if (bVar1) {
    if (now == 0) {
      time(&now);
    }
    bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
    if (!bVar1) {
      return false;
    }
    tVar2 = time(&local_28);
    if (now <= tVar2 + -5) {
      return false;
    }
  }
  SocketServer::block(this->m_pServer,&this->super_Strategy,true,0.0);
  return true;
}

Assistant:

bool SocketAcceptor::onPoll() {
  if (!m_pServer) {
    return false;
  }

  time_t start = 0;
  time_t now = 0;

  if (isStopped()) {
    if (start == 0) {
      ::time(&start);
    }
    if (!isLoggedOn()) {
      start = 0;
      return false;
    }
    if (::time(&now) - 5 >= start) {
      start = 0;
      return false;
    }
  }

  m_pServer->block(*this, true);
  return true;
}